

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O0

void helix_session_subscribe(helix_session_t session,char *symbol,size_t max_orders)

{
  session *psVar1;
  undefined8 in_RDX;
  char *in_RSI;
  helix_session_t in_RDI;
  allocator local_39;
  string local_38 [32];
  undefined8 local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  psVar1 = unwrap(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_10,&local_39);
  (*psVar1->_vptr_session[3])(psVar1,local_38,local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void helix_session_subscribe(helix_session_t session, const char *symbol, size_t max_orders)
{
    unwrap(session)->subscribe(symbol, max_orders);
}